

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,string *toFile,mode_t permissions)

{
  char *__s;
  cmCommand *this_00;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  bool bVar4;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  bVar4 = true;
  if (permissions != 0) {
    bVar1 = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      __s = this->Name;
      if (__s == (char *)0x0) {
        std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198," cannot set permissions on \"",0x1c);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(toFile->_M_dataplus)._M_p,toFile->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool cmFileCopier::SetPermissions(const std::string& toFile,
                                  mode_t permissions)
{
  if (permissions) {
#ifdef WIN32
    if (Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
      // Store the mode in an NTFS alternate stream.
      std::string mode_t_adt_filename = toFile + ":cmake_mode_t";

      // Writing to an NTFS alternate stream changes the modification
      // time, so we need to save and restore its original value.
      cmSystemToolsFileTime* file_time_orig = cmSystemTools::FileTimeNew();
      cmSystemTools::FileTimeGet(toFile, file_time_orig);

      cmsys::ofstream permissionStream(mode_t_adt_filename.c_str());

      if (permissionStream) {
        permissionStream << std::oct << permissions << std::endl;
      }

      permissionStream.close();

      cmSystemTools::FileTimeSet(toFile, file_time_orig);

      cmSystemTools::FileTimeDelete(file_time_orig);
    }
#endif

    if (!cmSystemTools::SetPermissions(toFile, permissions)) {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }
  return true;
}